

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_popen(lua_State *L)

{
  int iVar1;
  char *fname;
  undefined8 *puVar2;
  
  fname = luaL_checklstring(L,1,(size_t *)0x0);
  luaL_optlstring(L,2,"r",(size_t *)0x0);
  puVar2 = (undefined8 *)lua_newuserdata(L,0x10);
  puVar2[1] = 0;
  luaL_setmetatable(L,"FILE*");
  luaL_error(L,"\'popen\' not supported");
  *puVar2 = 0;
  puVar2[1] = io_pclose;
  iVar1 = luaL_fileresult(L,0,fname);
  return iVar1;
}

Assistant:

static int io_popen (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newprefile(L);
  p->f = l_popen(L, filename, mode);
  p->closef = &io_pclose;
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}